

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sbox.cpp
# Opt level: O2

void __thiscall Sbox::~Sbox(Sbox *this)

{
  Sequence **ppSVar1;
  Sequence *pSVar2;
  _Map_pointer ppiVar3;
  long lVar4;
  int i;
  long lVar5;
  
  for (lVar5 = 0; ppSVar1 = this->m_tab, lVar5 != 4; lVar5 = lVar5 + 1) {
    pSVar2 = ppSVar1[lVar5];
    if (pSVar2 != (Sequence *)0x0) {
      ppiVar3 = pSVar2[-1].m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      if (ppiVar3 != (_Map_pointer)0x0) {
        lVar4 = (long)ppiVar3 * 0x58;
        do {
          Sequence::~Sequence((Sequence *)((long)&pSVar2[-1]._vptr_Sequence + lVar4));
          lVar4 = lVar4 + -0x58;
        } while (lVar4 != 0);
      }
      operator_delete__(&pSVar2[-1].m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node,(long)ppiVar3 * 0x58 + 8);
    }
  }
  if (ppSVar1 != (Sequence **)0x0) {
    operator_delete__(ppSVar1);
    return;
  }
  return;
}

Assistant:

Sbox::~Sbox() {
    for (auto i = 0; i < 4; ++i) {
        delete[] m_tab[i];
    }
    delete[] m_tab;
}